

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O2

void voc_push_vocoldef_list(voccxdef *ctx,vocoldef *objlist,int cnt)

{
  ulong uVar1;
  uchar *puVar2;
  long lVar3;
  ulong uVar4;
  uint lstsiz;
  
  uVar1 = 0;
  uVar4 = (ulong)(uint)cnt;
  if (cnt < 1) {
    uVar4 = uVar1;
  }
  lstsiz = 0;
  for (; uVar4 * 0x28 - uVar1 != 0; uVar1 = uVar1 + 0x28) {
    lstsiz = lstsiz + (uint)(*(short *)((long)&objlist->vocolobj + uVar1) != -1) * 2 + 1;
  }
  puVar2 = voc_push_list_siz(ctx,lstsiz);
  for (lVar3 = 0; uVar4 * 0x28 - lVar3 != 0; lVar3 = lVar3 + 0x28) {
    if (*(short *)((long)&objlist->vocolobj + lVar3) == -1) {
      *puVar2 = '\x05';
      puVar2 = puVar2 + 1;
    }
    else {
      *puVar2 = '\x02';
      *(undefined2 *)(puVar2 + 1) = *(undefined2 *)((long)&objlist->vocolobj + lVar3);
      puVar2 = puVar2 + 3;
    }
  }
  return;
}

Assistant:

void voc_push_vocoldef_list(voccxdef *ctx, vocoldef *objlist, int cnt)
{
    int i;
    uchar *lstp;
    uint lstsiz;

    /* 
     *   count the size - we need 3 bytes per object (1 for type plus 2
     *   for the value), and 1 byte per nil 
     */
    for (lstsiz = 0, i = 0 ; i < cnt ; ++i)
        lstsiz += (objlist[i].vocolobj == MCMONINV ? 1 : 3);

    /* allocate space for the list */
    lstp = voc_push_list_siz(ctx, lstsiz);

    /* enter the list elements */
    for (i = 0 ; i < cnt ; ++i)
    {
        if (objlist[i].vocolobj == MCMONINV)
        {
            /* store the nil */
            *lstp++ = DAT_NIL;
        }
        else
        {
            /* add the type prefix */
            *lstp++ = DAT_OBJECT;

            /* add the value */
            oswp2(lstp, objlist[i].vocolobj);
            lstp += 2;
        }
    }
}